

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_size_valid_fn(int _i)

{
  char *pcVar1;
  size_t sVar2;
  int line;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_28 = 0;
  local_18 = 0;
  uStack_10 = 0;
  local_38 = 0;
  uStack_30 = 0;
  uStack_20 = 0x2a;
  sVar2 = private_ACUtils_ADynArray_size(&local_38);
  if (sVar2 == 0x2a) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x88);
    uStack_20 = 0xd;
    sVar2 = private_ACUtils_ADynArray_size(&local_38);
    if (sVar2 == 0xd) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x8a);
      uStack_20 = 0;
      sVar2 = private_ACUtils_ADynArray_size(&local_38);
      if (sVar2 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x8c);
        return;
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x8c,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "private_ACUtils_ADynArray_size(&array) == 0",
                        "private_ACUtils_ADynArray_size(&array)",sVar2,"0",0,0);
    }
    pcVar1 = "(void*) AString_buffer(&string) == (void*) (char*) 13";
    pcVar3 = "private_ACUtils_ADynArray_size(&array) == 13";
    line = 0x8a;
    uVar4 = 0xd;
  }
  else {
    pcVar1 = "(void*) AString_buffer(&string) == (void*) (char*) 42";
    pcVar3 = "private_ACUtils_ADynArray_size(&array) == 42";
    line = 0x88;
    uVar4 = 0x2a;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar3,
                    "private_ACUtils_ADynArray_size(&array)",sVar2,pcVar1 + 0x33,uVar4,0);
}

Assistant:

START_TEST(test_ADynArray_size_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {nullptr, nullptr};
    array.capacity = 0;
    array.buffer = nullptr;
    array.growStrategy = nullptr;
    array.size = 42;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(&array), 42);
    array.size = 13;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(&array), 13);
    array.size = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(&array), 0);
}